

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostats.cpp
# Opt level: O1

stats_data * __thiscall
foxxll::stats_data::operator+(stats_data *__return_storage_ptr__,stats_data *this,stats_data *a)

{
  vector<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_> *__result;
  pointer *ppfVar1;
  pointer pfVar2;
  pointer pfVar3;
  iterator iVar4;
  external_size_type eVar5;
  external_size_type eVar6;
  double dVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined4 uVar11;
  pointer __args;
  file_stats_data *__first;
  pointer this_00;
  pointer __last;
  file_stats_data local_60;
  
  (__return_storage_ptr__->file_stats_data_list_).
  super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->file_stats_data_list_).
  super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->elapsed_ = 0.0;
  (__return_storage_ptr__->file_stats_data_list_).
  super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  __return_storage_ptr__->t_wait_read_ = 0.0;
  __return_storage_ptr__->t_wait_write_ = 0.0;
  __return_storage_ptr__->p_ios_ = 0.0;
  __return_storage_ptr__->t_wait = 0.0;
  __return_storage_ptr__->p_reads_ = 0.0;
  __return_storage_ptr__->p_writes_ = 0.0;
  this_00 = (this->file_stats_data_list_).
            super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pfVar2 = (this->file_stats_data_list_).
           super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  __args = (a->file_stats_data_list_).
           super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pfVar3 = (a->file_stats_data_list_).
           super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  __result = &__return_storage_ptr__->file_stats_data_list_;
  while ((__first = __args, __last = pfVar3, this_00 != pfVar2 &&
         (__first = this_00, __last = pfVar2, __args != pfVar3))) {
    if (this_00->device_id_ < __args->device_id_) {
      iVar4._M_current =
           (__return_storage_ptr__->file_stats_data_list_).
           super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (__return_storage_ptr__->file_stats_data_list_).
          super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<foxxll::file_stats_data,std::allocator<foxxll::file_stats_data>>::
        _M_realloc_insert<foxxll::file_stats_data_const&>
                  ((vector<foxxll::file_stats_data,std::allocator<foxxll::file_stats_data>> *)
                   __result,iVar4,this_00);
      }
      else {
        uVar8 = this_00->device_id_;
        uVar9 = this_00->read_count_;
        uVar10 = this_00->write_count_;
        uVar11 = *(undefined4 *)&this_00->field_0xc;
        eVar5 = this_00->read_bytes_;
        eVar6 = this_00->write_bytes_;
        dVar7 = this_00->write_time_;
        (iVar4._M_current)->read_time_ = this_00->read_time_;
        (iVar4._M_current)->write_time_ = dVar7;
        (iVar4._M_current)->read_bytes_ = eVar5;
        (iVar4._M_current)->write_bytes_ = eVar6;
        (iVar4._M_current)->device_id_ = uVar8;
        (iVar4._M_current)->read_count_ = uVar9;
        (iVar4._M_current)->write_count_ = uVar10;
        *(undefined4 *)&(iVar4._M_current)->field_0xc = uVar11;
        ppfVar1 = &(__return_storage_ptr__->file_stats_data_list_).
                   super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppfVar1 = *ppfVar1 + 1;
      }
      this_00 = this_00 + 1;
    }
    else {
      if (this_00->device_id_ == __args->device_id_) {
        file_stats_data::operator+(&local_60,this_00,__args);
        iVar4._M_current =
             (__return_storage_ptr__->file_stats_data_list_).
             super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (__return_storage_ptr__->file_stats_data_list_).
            super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>::
          _M_realloc_insert<foxxll::file_stats_data>(__result,iVar4,&local_60);
        }
        else {
          (iVar4._M_current)->read_time_ = local_60.read_time_;
          (iVar4._M_current)->write_time_ = local_60.write_time_;
          (iVar4._M_current)->read_bytes_ = local_60.read_bytes_;
          (iVar4._M_current)->write_bytes_ = local_60.write_bytes_;
          (iVar4._M_current)->device_id_ = local_60.device_id_;
          (iVar4._M_current)->read_count_ = local_60.read_count_;
          (iVar4._M_current)->write_count_ = local_60.write_count_;
          *(undefined4 *)&(iVar4._M_current)->field_0xc = local_60._12_4_;
          ppfVar1 = &(__return_storage_ptr__->file_stats_data_list_).
                     super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppfVar1 = *ppfVar1 + 1;
        }
        this_00 = this_00 + 1;
      }
      else {
        iVar4._M_current =
             (__return_storage_ptr__->file_stats_data_list_).
             super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (__return_storage_ptr__->file_stats_data_list_).
            super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<foxxll::file_stats_data,std::allocator<foxxll::file_stats_data>>::
          _M_realloc_insert<foxxll::file_stats_data_const&>
                    ((vector<foxxll::file_stats_data,std::allocator<foxxll::file_stats_data>> *)
                     __result,iVar4,__args);
        }
        else {
          uVar8 = __args->device_id_;
          uVar9 = __args->read_count_;
          uVar10 = __args->write_count_;
          uVar11 = *(undefined4 *)&__args->field_0xc;
          eVar5 = __args->read_bytes_;
          eVar6 = __args->write_bytes_;
          dVar7 = __args->write_time_;
          (iVar4._M_current)->read_time_ = __args->read_time_;
          (iVar4._M_current)->write_time_ = dVar7;
          (iVar4._M_current)->read_bytes_ = eVar5;
          (iVar4._M_current)->write_bytes_ = eVar6;
          (iVar4._M_current)->device_id_ = uVar8;
          (iVar4._M_current)->read_count_ = uVar9;
          (iVar4._M_current)->write_count_ = uVar10;
          *(undefined4 *)&(iVar4._M_current)->field_0xc = uVar11;
          ppfVar1 = &(__return_storage_ptr__->file_stats_data_list_).
                     super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppfVar1 = *ppfVar1 + 1;
        }
      }
      __args = __args + 1;
    }
  }
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<foxxll::file_stats_data_const*,std::back_insert_iterator<std::vector<foxxll::file_stats_data,std::allocator<foxxll::file_stats_data>>>>
            (__first,__last,
             (back_insert_iterator<std::vector<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>_>
              )__result);
  __return_storage_ptr__->p_reads_ = this->p_reads_ + a->p_reads_;
  __return_storage_ptr__->p_writes_ = this->p_writes_ + a->p_writes_;
  __return_storage_ptr__->p_ios_ = this->p_ios_ + a->p_ios_;
  __return_storage_ptr__->t_wait = this->t_wait + a->t_wait;
  __return_storage_ptr__->t_wait_read_ = this->t_wait_read_ + a->t_wait_read_;
  __return_storage_ptr__->t_wait_write_ = this->t_wait_write_ + a->t_wait_write_;
  __return_storage_ptr__->elapsed_ = this->elapsed_ + a->elapsed_;
  return __return_storage_ptr__;
}

Assistant:

stats_data stats_data::operator + (const stats_data& a) const
{
    stats_data s;

    tlx::merge_combine(
        file_stats_data_list_.cbegin(), file_stats_data_list_.cend(),
        a.file_stats_data_list_.cbegin(), a.file_stats_data_list_.cend(),
        std::back_inserter(s.file_stats_data_list_),
        FileStatsDataCompare(),
        [](const file_stats_data& a, const file_stats_data& b) {
            return a + b;
        }
    );

    s.p_reads_ = p_reads_ + a.p_reads_;
    s.p_writes_ = p_writes_ + a.p_writes_;
    s.p_ios_ = p_ios_ + a.p_ios_;
    s.t_wait = t_wait + a.t_wait;
    s.t_wait_read_ = t_wait_read_ + a.t_wait_read_;
    s.t_wait_write_ = t_wait_write_ + a.t_wait_write_;
    s.elapsed_ = elapsed_ + a.elapsed_;
    return s;
}